

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void build_d_d_ea(m68k_info *info,int opcode,int size)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  uVar2 = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    uVar2 = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                          *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  MCInst_setOpcode(info->inst,0x2b);
  (info->extension).op_count = '\x03';
  (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
  (info->extension).op_size.field_1.cpu_size = opcode;
  (info->extension).operands[0].address_mode = M68K_AM_REG_DIRECT_DATA;
  (info->extension).operands[0].field_0.reg = (uVar2 & 7) + M68K_REG_D0;
  (info->extension).operands[1].address_mode = M68K_AM_REG_DIRECT_DATA;
  (info->extension).operands[1].field_0.reg = (uVar2 >> 6 & 7) + M68K_REG_D0;
  get_ea_mode_op(info,(info->extension).operands + 2,info->ir,opcode);
  return;
}

Assistant:

static void build_d_d_ea(m68k_info *info, int opcode, int size)
{
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	cs_m68k_op* op2;
	uint extension = read_imm_16(info);
	cs_m68k* ext = build_init_op(info, opcode, 3, size);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];
	op2 = &ext->operands[2];

	op0->address_mode = M68K_AM_REG_DIRECT_DATA;
	op0->reg = M68K_REG_D0 + (extension & 7);

	op1->address_mode = M68K_AM_REG_DIRECT_DATA;
	op1->reg = M68K_REG_D0 + ((extension >> 6) & 7);

	get_ea_mode_op(info, op2, info->ir, size);
}